

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::pushOpStack(VirtualMachine *this,Variable v)

{
  pointer *ppVVar1;
  element_type *peVar2;
  iterator __position;
  string local_50;
  undefined1 auStack_30 [8];
  Variable v_local;
  
  v_local._0_8_ = v.field_1;
  auStack_30._0_4_ = v.type;
  peVar2 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 != (element_type *)0x0) {
    __position._M_current =
         (peVar2->opStack).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (peVar2->opStack).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<runtime::Variable,std::allocator<runtime::Variable>>::
      _M_realloc_insert<runtime::Variable_const&>
                ((vector<runtime::Variable,std::allocator<runtime::Variable>> *)&peVar2->opStack,
                 __position,(Variable *)auStack_30);
    }
    else {
      *(ulong *)__position._M_current = CONCAT44(auStack_30._4_4_,auStack_30._0_4_);
      ((__position._M_current)->field_1).integerValue = v_local._0_8_;
      ppVVar1 = &(peVar2->opStack).
                 super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppVVar1 = *ppVVar1 + 1;
    }
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"No active stack frame found to push op stack!","");
  panic(this,&local_50);
}

Assistant:

void runtime::VirtualMachine::pushOpStack(Variable v) {
  if (this->stackFrame == nullptr) {
    this->panic("No active stack frame found to push op stack!");
  }

  this->stackFrame->opStack.push_back(v);
}